

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O0

void __thiscall
matrix_sparse_row_test_sparse_accessor_Test::TestBody
          (matrix_sparse_row_test_sparse_accessor_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  const_reference_value pdVar5;
  char *pcVar6;
  const_reference_index piVar7;
  reference_value pdVar8;
  char *regex;
  CSR_Data<double,_int> *matrix;
  SparseAccessor SVar9;
  AssertHelper local_468;
  Message local_460;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_458;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_13;
  Message local_430;
  int local_424;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_420;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_12;
  Message local_3f8;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_3f0;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_11;
  Message local_3c8;
  int local_3bc;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_3b8;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_10;
  Message local_390;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_388;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_9;
  Message local_360;
  int local_354;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_350;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_8;
  Message local_328;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_320;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_7;
  Message local_2f8;
  int local_2ec;
  Base_Iterator_Matrix_Sparse_Element<double,_int,_false> local_2e8;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_6;
  iterator it;
  Message local_2b0;
  int local_2a4;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_5;
  Message local_288;
  int local_280;
  index_type local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_4;
  Message local_260;
  int local_258;
  index_type local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_3;
  Message local_238;
  Matrix_Sparse_Row<double,_int> *local_230;
  index_type local_228;
  index_type local_21c;
  Matrix_Sparse_Row<double,_int> *local_218;
  index_type local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_2;
  index_type local_1e4;
  SparseAccessor local_1e0;
  double local_1d0;
  AssertHelper local_1c8;
  Message local_1c0;
  Matrix_Sparse_Row<double,_int> *local_1b8;
  index_type local_1b0;
  index_type local_1a4;
  Matrix_Sparse_Row<double,_int> *local_1a0;
  index_type local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  index_type local_16c;
  SparseAccessor local_168;
  double local_158;
  AssertHelper local_150;
  Message local_148;
  int local_13c;
  exception *gtest_exception;
  index_type local_108;
  index_type local_fc;
  Matrix_Sparse_Row<double,_int> *local_f8;
  index_type local_f0;
  ReturnSentinel local_e8;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_c0;
  DeathTest *gtest_dt;
  double force_read;
  Message local_a8 [3];
  Matrix_Sparse_Row<double,_int> *local_90;
  index_type local_88;
  index_type local_7c;
  Matrix_Sparse_Row<double,_int> *local_78;
  index_type local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  iterator iStack_50;
  int initial_offset;
  int *local_48;
  undefined1 local_40 [8];
  Matrix_Sparse_Row<double,_int> row;
  matrix_sparse_row_test_sparse_accessor_Test *this_local;
  
  matrix = &(this->super_matrix_sparse_row_test).csr_data;
  row.value._M_extent._M_extent_value = (size_t)this;
  iStack_50 = std::vector<int,_std::allocator<int>_>::begin(&matrix->row_offset);
  local_48 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(&stack0xffffffffffffffb0,2);
  Disa::Matrix_Sparse_Row<double,_int>::Matrix_Sparse_Row
            ((Matrix_Sparse_Row<double,_int> *)local_40,matrix,(index_iterator)local_48);
  pvVar4 = std::vector<int,_std::allocator<int>_>::back(&matrix->row_offset);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = *pvVar4;
  local_7c = 1;
  SVar9 = Disa::Matrix_Sparse_Row<double,_int>::operator[]
                    ((Matrix_Sparse_Row<double,_int> *)local_40,&local_7c);
  local_90 = SVar9.row_;
  local_88 = SVar9.i_column;
  local_78 = local_90;
  local_70 = local_88;
  pdVar5 = Disa::Matrix_Sparse_Row::SparseAccessor::operator_cast_to_double_
                     ((SparseAccessor *)&local_78);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_68,"row[1]","3.0",*pdVar5,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&force_read,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x12e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&force_read,local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&force_read);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("force_read = row[0]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0x132,&local_c0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_c0 == (pointer)0x0) goto LAB_00119a6e;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_c0);
      iVar2 = (*local_c0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_c0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_c0->_vptr_DeathTest[4])(local_c0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0011997e;
        local_13c = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_e8,local_c0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            local_fc = 0;
            SVar9 = Disa::Matrix_Sparse_Row<double,_int>::operator[]
                              ((Matrix_Sparse_Row<double,_int> *)local_40,&local_fc);
            gtest_exception = (exception *)SVar9.row_;
            local_108 = SVar9.i_column;
            local_f8 = (Matrix_Sparse_Row<double,_int> *)gtest_exception;
            local_f0 = local_108;
            pdVar5 = Disa::Matrix_Sparse_Row::SparseAccessor::operator_cast_to_double_
                               ((SparseAccessor *)&local_f8);
            gtest_dt = (DeathTest *)*pdVar5;
          }
          (*local_c0->_vptr_DeathTest[5])(local_c0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_e8);
        }
LAB_0011997e:
        local_13c = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_13c == 0) goto LAB_00119a6e;
    }
  }
  testing::Message::Message(&local_148);
  pcVar6 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_150,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
             ,0x132,pcVar6);
  testing::internal::AssertHelper::operator=(&local_150,&local_148);
  testing::internal::AssertHelper::~AssertHelper(&local_150);
  testing::Message::~Message(&local_148);
LAB_00119a6e:
  local_158 = 10.0;
  local_16c = 3;
  SVar9 = Disa::Matrix_Sparse_Row<double,_int>::operator[]
                    ((Matrix_Sparse_Row<double,_int> *)local_40,&local_16c);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )SVar9.row_;
  local_168.i_column = SVar9.i_column;
  local_168.row_ =
       (Matrix_Sparse_Row<double,_int> *)
       gtest_ar_1.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  Disa::Matrix_Sparse_Row<double,_int>::SparseAccessor::operator=(&local_168,&local_158);
  local_1a4 = 3;
  SVar9 = Disa::Matrix_Sparse_Row<double,_int>::operator[]
                    ((Matrix_Sparse_Row<double,_int> *)local_40,&local_1a4);
  local_1b8 = SVar9.row_;
  local_1b0 = SVar9.i_column;
  local_1a0 = local_1b8;
  local_198 = local_1b0;
  pdVar5 = Disa::Matrix_Sparse_Row::SparseAccessor::operator_cast_to_double_
                     ((SparseAccessor *)&local_1a0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_190,"row[3]","10.0",*pdVar5,10.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x136,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1d0 = 8.0;
  local_1e4 = 2;
  SVar9 = Disa::Matrix_Sparse_Row<double,_int>::operator[]
                    ((Matrix_Sparse_Row<double,_int> *)local_40,&local_1e4);
  gtest_ar_2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )SVar9.row_;
  local_1e0.i_column = SVar9.i_column;
  local_1e0.row_ =
       (Matrix_Sparse_Row<double,_int> *)
       gtest_ar_2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  Disa::Matrix_Sparse_Row<double,_int>::SparseAccessor::operator=(&local_1e0,&local_1d0);
  local_21c = 2;
  SVar9 = Disa::Matrix_Sparse_Row<double,_int>::operator[]
                    ((Matrix_Sparse_Row<double,_int> *)local_40,&local_21c);
  local_230 = SVar9.row_;
  local_228 = SVar9.i_column;
  local_218 = local_230;
  local_210 = local_228;
  pdVar5 = Disa::Matrix_Sparse_Row::SparseAccessor::operator_cast_to_double_
                     ((SparseAccessor *)&local_218);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_208,"row[2]","8.0",*pdVar5,8.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x13a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_254 = Disa::Matrix_Sparse_Row<double,_int>::row_offset
                        ((Matrix_Sparse_Row<double,_int> *)local_40);
  local_258 = 6;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_250,"row.row_offset()","6",&local_254,&local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x13d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_27c = Disa::Matrix_Sparse_Row<double,_int>::size_non_zero
                        ((Matrix_Sparse_Row<double,_int> *)local_40);
  local_280 = 4;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_278,"row.size_non_zero()","4",&local_27c,&local_280);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x13e,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  pvVar4 = std::vector<int,_std::allocator<int>_>::back
                     (&(this->super_matrix_sparse_row_test).csr_data.row_offset);
  local_2a4 = gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ + 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2a0,"csr_data.row_offset.back()","initial_offset + 1",pvVar4,
             &local_2a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&it.ptr_entry,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x13f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&it.ptr_entry,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&it.ptr_entry);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  join_0x00000010_0x00000000_ =
       Disa::Matrix_Sparse_Row<double,_int>::begin((Matrix_Sparse_Row<double,_int> *)local_40);
  Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>::operator*(&local_2e8);
  piVar7 = Disa::Matrix_Sparse_Element<double,_int>::i_column
                     ((Matrix_Sparse_Element<double,_int> *)&local_2e8);
  local_2ec = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2d8,"(*it).i_column()","1",piVar7,&local_2ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x142,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>::operator*(&local_320);
  pdVar8 = Disa::Matrix_Sparse_Element<double,_int>::value
                     ((Matrix_Sparse_Element<double,_int> *)&local_320);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_310,"(*it).value()","3.0",*pdVar8,3.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x143,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>::operator++
            ((Base_Iterator_Matrix_Sparse_Element<double,_int,_false> *)&gtest_ar_6.message_);
  Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>::operator*(&local_350);
  piVar7 = Disa::Matrix_Sparse_Element<double,_int>::i_column
                     ((Matrix_Sparse_Element<double,_int> *)&local_350);
  local_354 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_340,"(*it).i_column()","2",piVar7,&local_354);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x145,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>::operator*(&local_388);
  pdVar8 = Disa::Matrix_Sparse_Element<double,_int>::value
                     ((Matrix_Sparse_Element<double,_int> *)&local_388);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_378,"(*it).value()","8.0",*pdVar8,8.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x146,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>::operator++
            ((Base_Iterator_Matrix_Sparse_Element<double,_int,_false> *)&gtest_ar_6.message_);
  Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>::operator*(&local_3b8);
  piVar7 = Disa::Matrix_Sparse_Element<double,_int>::i_column
                     ((Matrix_Sparse_Element<double,_int> *)&local_3b8);
  local_3bc = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3a8,"(*it).i_column()","3",piVar7,&local_3bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3c8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x148,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_3c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>::operator*(&local_3f0);
  pdVar8 = Disa::Matrix_Sparse_Element<double,_int>::value
                     ((Matrix_Sparse_Element<double,_int> *)&local_3f0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_3e0,"(*it).value()","10.0",*pdVar8,10.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x149,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
  Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>::operator++
            ((Base_Iterator_Matrix_Sparse_Element<double,_int,_false> *)&gtest_ar_6.message_);
  Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>::operator*(&local_420);
  piVar7 = Disa::Matrix_Sparse_Element<double,_int>::i_column
                     ((Matrix_Sparse_Element<double,_int> *)&local_420);
  local_424 = 4;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_410,"(*it).i_column()","4",piVar7,&local_424);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x14b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  Disa::Base_Iterator_Matrix_Sparse_Element<double,_int,_false>::operator*(&local_458);
  pdVar8 = Disa::Matrix_Sparse_Element<double,_int>::value
                     ((Matrix_Sparse_Element<double,_int> *)&local_458);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_448,"(*it).value()","5.0",*pdVar8,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x14c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, sparse_accessor) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);
  const int initial_offset = csr_data.row_offset.back();
  // Read existing element
  EXPECT_DOUBLE_EQ(row[1], 3.0);

  // Death on 'read' like operation of non existing column.
  double force_read;
  EXPECT_DEATH(force_read = row[0], "./*");

  // Modify existing element
  row[3] = 10.0;
  EXPECT_DOUBLE_EQ(row[3], 10.0);

  // Insert new element
  row[2] = 8.0;
  EXPECT_DOUBLE_EQ(row[2], 8.0);

  // Verify row properties after modification
  EXPECT_EQ(row.row_offset(), 6);                             // added one entry
  EXPECT_EQ(row.size_non_zero(), 4);                          // added one entry
  EXPECT_EQ(csr_data.row_offset.back(), initial_offset + 1);  // added one entry

  auto it = row.begin();
  EXPECT_EQ((*it).i_column(), 1);
  EXPECT_DOUBLE_EQ((*it).value(), 3.0);
  ++it;
  EXPECT_EQ((*it).i_column(), 2);
  EXPECT_DOUBLE_EQ((*it).value(), 8.0);
  ++it;
  EXPECT_EQ((*it).i_column(), 3);
  EXPECT_DOUBLE_EQ((*it).value(), 10.0);
  ++it;
  EXPECT_EQ((*it).i_column(), 4);
  EXPECT_DOUBLE_EQ((*it).value(), 5.0);
}